

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O0

_Bool Curl_cert_hostcheck(char *match,size_t matchlen,char *hostname,size_t hostlen)

{
  size_t hostlen_local;
  char *hostname_local;
  size_t matchlen_local;
  char *match_local;
  
  if ((((match == (char *)0x0) || (*match == '\0')) || (hostname == (char *)0x0)) ||
     (*hostname == '\0')) {
    match_local._7_1_ = false;
  }
  else {
    match_local._7_1_ = hostmatch(hostname,hostlen,match,matchlen);
  }
  return match_local._7_1_;
}

Assistant:

bool Curl_cert_hostcheck(const char *match, size_t matchlen,
                         const char *hostname, size_t hostlen)
{
  if(match && *match && hostname && *hostname)
    return hostmatch(hostname, hostlen, match, matchlen);
  return FALSE;
}